

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

string * __thiscall
m2d::savanna::endpoint::build_url_str_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (**this->_vptr_endpoint)(&local_30);
  std::operator+(&local_50,&local_30,"://");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (*this->_vptr_endpoint[1])(&local_50,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  iVar1 = (*this->_vptr_endpoint[6])(this);
  if (iVar1 != 0x50) {
    iVar1 = (*this->_vptr_endpoint[6])(this);
    std::__cxx11::to_string(&local_30,iVar1);
    std::operator+(&local_50,":",&local_30);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (*this->_vptr_endpoint[5])(&local_50,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string build_url_str()
		{
			std::string new_url;
			new_url += scheme() + "://";
			new_url += host();
			if (port() != 80) {
				new_url += ":" + std::to_string(port());
			}
			new_url += build_path();

			return new_url;
		}